

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O0

_anonymous_namespace_ * __thiscall
gflags::(anonymous_namespace)::ReadFileIntoString_abi_cxx11_
          (_anonymous_namespace_ *this,char *filename)

{
  int iVar1;
  int *piVar2;
  _anonymous_namespace_ *p_Var3;
  size_t sVar4;
  size_t n;
  FILE *local_1fc8;
  FILE *fp;
  undefined1 local_1fb8 [8];
  char buffer [8092];
  int kBufSize;
  char *filename_local;
  string *s;
  
  buffer[0x1f94] = -100;
  buffer[0x1f95] = '\x1f';
  buffer[0x1f96] = '\0';
  buffer[0x1f97] = '\0';
  fp._7_1_ = 0;
  unique0x10000117 = filename;
  std::__cxx11::string::string((string *)this);
  iVar1 = SafeFOpen((FILE **)&local_1fc8,stack0xffffffffffffffe8,"r");
  piVar2 = __errno_location();
  *piVar2 = iVar1;
  if (iVar1 != 0) {
    perror(stack0xffffffffffffffe8);
    p_Var3 = (_anonymous_namespace_ *)(*(code *)gflags_exitfunc)(1);
    return p_Var3;
  }
  while( true ) {
    sVar4 = fread(local_1fb8,1,0x1f9c,local_1fc8);
    if (sVar4 == 0) {
      fclose(local_1fc8);
      return this;
    }
    iVar1 = ferror(local_1fc8);
    if (iVar1 != 0) break;
    std::__cxx11::string::append((char *)this,(ulong)local_1fb8);
  }
  perror(stack0xffffffffffffffe8);
  p_Var3 = (_anonymous_namespace_ *)(*(code *)gflags_exitfunc)(1);
  return p_Var3;
}

Assistant:

static string ReadFileIntoString(const char* filename) {
  const int kBufSize = 8092;
  char buffer[kBufSize];
  string s;
  FILE* fp;
  if ((errno = SafeFOpen(&fp, filename, "r")) != 0) PFATAL(filename);
  size_t n;
  while ( (n=fread(buffer, 1, kBufSize, fp)) > 0 ) {
    if (ferror(fp))  PFATAL(filename);
    s.append(buffer, n);
  }
  fclose(fp);
  return s;
}